

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_YMW_Bank(VGMPlayer *this)

{
  byte bVar1;
  UINT8 *pUVar2;
  CHIP_DEVICE *pCVar3;
  DEVFUNC_WRITE_A8D8 UNRECOVERED_JUMPTABLE;
  ulong uVar4;
  byte bVar5;
  DEV_DATA *pDVar6;
  UINT8 UStack_20;
  
  pCVar3 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        this->_fileData[(ulong)this->_filePos + 1] >> 7);
  if (pCVar3 == (CHIP_DEVICE *)0x0) {
    return;
  }
  UNRECOVERED_JUMPTABLE = pCVar3->write8;
  if (UNRECOVERED_JUMPTABLE == (DEVFUNC_WRITE_A8D8)0x0) {
    return;
  }
  pUVar2 = this->_fileData;
  uVar4 = (ulong)this->_filePos;
  bVar1 = pUVar2[uVar4 + 1];
  bVar5 = bVar1 & 3;
  if (bVar5 == 3) {
    bVar5 = pUVar2[uVar4 + 2];
    if ((bVar5 & 8) == 0) {
      pDVar6 = (pCVar3->base).defInf.dataPtr;
      bVar5 = bVar5 >> 4;
      UStack_20 = '\x10';
      goto LAB_001266b7;
    }
LAB_0012667e:
    (*UNRECOVERED_JUMPTABLE)((pCVar3->base).defInf.dataPtr,'\x11',bVar5 >> 3);
  }
  else if (1 < bVar5) {
    bVar5 = pUVar2[uVar4 + 2];
    goto LAB_0012667e;
  }
  if ((bVar1 & 1) == 0) {
    return;
  }
  pDVar6 = (pCVar3->base).defInf.dataPtr;
  UNRECOVERED_JUMPTABLE = pCVar3->write8;
  bVar5 = this->_fileData[(ulong)this->_filePos + 2] >> 3;
  UStack_20 = '\x12';
LAB_001266b7:
  (*UNRECOVERED_JUMPTABLE)(pDVar6,UStack_20,bVar5);
  return;
}

Assistant:

void VGMPlayer::Cmd_YMW_Bank(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	UINT8 bankmask = fData[0x01] & 0x03;
	// fData[0x03] is ignored as we don't support YMW258 ROMs > 16 MB
	if (bankmask == 0x03 && ! (fData[0x02] & 0x08))
	{
		// 1 MB banking (reg 0x10)
		cDev->write8(cDev->base.defInf.dataPtr, 0x10, fData[0x02] / 0x10);
	}
	else
	{
		// 512 KB banking (regs 0x11/0x12)
		if (bankmask & 0x02)	// low bank
			cDev->write8(cDev->base.defInf.dataPtr, 0x11, fData[0x02] / 0x08);
		if (bankmask & 0x01)	// high bank
			cDev->write8(cDev->base.defInf.dataPtr, 0x12, fData[0x02] / 0x08);
	}
	
	return;
}